

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O2

char * host_ca_delete(char *name)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (*name != '\0') {
    pcVar2 = make_filename(7,name);
    iVar1 = remove(pcVar2);
    if (iVar1 < 0) {
      pcVar3 = dupprintf("Unable to delete file \'%s\'",pcVar2);
    }
    else {
      pcVar3 = (char *)0x0;
    }
    safefree(pcVar2);
    return pcVar3;
  }
  pcVar2 = dupstr("CA record must have a name");
  return pcVar2;
}

Assistant:

char *host_ca_delete(const char *name)
{
    if (!*name)
        return dupstr("CA record must have a name");
    char *filename = make_filename(INDEX_HOSTCA, name);
    bool bad = remove(filename) < 0;

    char *err = NULL;
    if (bad)
        err = dupprintf("Unable to delete file '%s'", filename);

    sfree(filename);
    return err;
}